

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  pointer puVar1;
  undefined8 uVar2;
  Array<char> *pAVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint64_t *puVar8;
  long lVar9;
  Data *pDVar10;
  int y;
  LineBuffer *pLVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  PixelType *pPVar15;
  char *writePtr;
  int local_54;
  char *readPtr;
  int local_44;
  LineBufferTask *local_40;
  char *compPtr;
  
  pDVar10 = this->_ofd;
  pLVar11 = this->_lineBuffer;
  if (*(int *)&(pDVar10->frameBuffer)._sampleCounts.base == 0) {
    puVar8 = &pLVar11->dataSize;
    local_44 = *(int *)((long)&pLVar11->dataSize + 4) + 1;
    local_54 = 1;
  }
  else {
    puVar8 = (uint64_t *)((long)&pLVar11->dataSize + 4);
    local_44 = (int)pLVar11->dataSize + -1;
    local_54 = -1;
  }
  local_40 = this;
  for (iVar12 = (int)*puVar8; iVar12 != local_44; iVar12 = iVar12 + local_54) {
    writePtr = (char *)((long)&((pLVar11->buffer)._data)->_size +
                       *(long *)(*(long *)&pDVar10->maxY +
                                ((long)iVar12 -
                                (long)*(int *)((long)&(pDVar10->frameBuffer)._sampleCounts.xStride +
                                              4)) * 8));
    uVar13 = 0;
    while( true ) {
      uVar14 = (ulong)uVar13;
      puVar1 = (pDVar10->bytesPerLine).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pDVar10->bytesPerLine).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar1) / 0x30) <= uVar14) break;
      iVar5 = Imath_3_2::modp(iVar12,*(int *)((long)puVar1 + uVar14 * 0x30 + 0x24));
      if (iVar5 == 0) {
        pPVar15 = (PixelType *)(puVar1 + uVar14 * 6);
        iVar5 = Imath_3_2::divp(*(int *)((long)&(this->_ofd->frameBuffer)._sampleCounts.base + 4),
                                pPVar15[8]);
        iVar6 = Imath_3_2::divp((int)(this->_ofd->frameBuffer)._sampleCounts.xStride,pPVar15[8]);
        if ((char)pPVar15[10] == HALF) {
          fillChannelWithZeroes
                    (&writePtr,
                     *(Format *)
                      &(this->_ofd->lineOffsets).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,*pPVar15,
                     (long)((iVar6 - iVar5) + 1));
        }
        else {
          uVar2 = *(undefined8 *)(pPVar15 + 2);
          iVar7 = Imath_3_2::divp(iVar12,pPVar15[9]);
          this = local_40;
          lVar9 = (long)iVar7 * *(undefined8 *)(pPVar15 + 6) + uVar2;
          uVar2 = *(undefined8 *)(pPVar15 + 4);
          readPtr = (char *)((long)iVar5 * uVar2 + lVar9);
          copyFromFrameBuffer(&writePtr,&readPtr,(char *)((long)iVar6 * uVar2 + lVar9),uVar2,
                              *(Format *)
                               &(local_40->_ofd->lineOffsets).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,*pPVar15);
        }
      }
      uVar13 = uVar13 + 1;
      pDVar10 = this->_ofd;
    }
    pLVar11 = this->_lineBuffer;
    if (pLVar11->dataPtr < writePtr) {
      pLVar11->dataPtr = writePtr;
    }
  }
  if ((local_44 < (int)pLVar11->uncompressedDataSize) ||
     (*(int *)((long)&pLVar11->uncompressedDataSize + 4) < local_44)) {
    pAVar3 = (pLVar11->buffer)._data;
    (pLVar11->consecutiveBuffer)._size = (long)pAVar3;
    *(int *)&(pLVar11->consecutiveBuffer)._data = *(int *)&pLVar11->dataPtr - (int)pAVar3;
    plVar4 = (long *)(pLVar11->sampleCountTableBuffer)._size;
    if (plVar4 != (long *)0x0) {
      iVar12 = (**(code **)(*plVar4 + 0x20))();
      pLVar11 = this->_lineBuffer;
      if (iVar12 < *(int *)&(pLVar11->consecutiveBuffer)._data) {
        *(int *)&(pLVar11->consecutiveBuffer)._data = iVar12;
        (pLVar11->consecutiveBuffer)._size = (long)compPtr;
      }
      else {
        pDVar10 = this->_ofd;
        if (*(int *)&(pDVar10->lineOffsets).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 0) {
          iVar5 = *(int *)((long)&pLVar11->uncompressedDataSize + 4);
          writePtr = (char *)(pLVar11->buffer)._data;
          for (iVar12 = (int)pLVar11->uncompressedDataSize; iVar12 <= iVar5; iVar12 = iVar12 + 1) {
            readPtr = writePtr;
            uVar13 = 0;
            while( true ) {
              uVar14 = (ulong)uVar13;
              puVar1 = (pDVar10->bytesPerLine).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)(((long)(pDVar10->bytesPerLine).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) / 0x30)
                  <= uVar14) break;
              iVar6 = Imath_3_2::modp(iVar12,*(int *)((long)puVar1 + uVar14 * 0x30 + 0x24));
              if (iVar6 == 0) {
                pPVar15 = (PixelType *)(puVar1 + uVar14 * 6);
                iVar6 = Imath_3_2::divp(*(int *)((long)&(pDVar10->frameBuffer)._sampleCounts.base +
                                                4),pPVar15[8]);
                iVar7 = Imath_3_2::divp((int)(pDVar10->frameBuffer)._sampleCounts.xStride,pPVar15[8]
                                       );
                convertInPlace(&writePtr,&readPtr,*pPVar15,(long)((iVar7 - iVar6) + 1));
              }
              uVar13 = uVar13 + 1;
            }
          }
          pLVar11 = this->_lineBuffer;
        }
      }
    }
    *(undefined1 *)&(pLVar11->sampleCountTableBuffer)._data = 0;
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the
        // frame buffer into the line buffer
        //

        int yStart, yStop, dy;

        if (_ofd->lineOrder == INCREASING_Y)
        {
            yStart = _lineBuffer->scanLineMin;
            yStop  = _lineBuffer->scanLineMax + 1;
            dy     = 1;
        }
        else
        {
            yStart = _lineBuffer->scanLineMax;
            yStop  = _lineBuffer->scanLineMin - 1;
            dy     = -1;
        }

        //
        // Allocate buffers for scanlines.
        // And calculate the sample counts for each line.
        //

        bytesPerDeepLineTable (
            _ofd->header,
            _lineBuffer->scanLineMin,
            _lineBuffer->scanLineMax,
            _ofd->sampleCountSliceBase,
            _ofd->sampleCountXStride,
            _ofd->sampleCountYStride,
            _ofd->bytesPerLine);
        for (int i = _lineBuffer->scanLineMin; i <= _lineBuffer->scanLineMax;
             i++)
        {
            // (TODO) don't do this all the time.
            _lineBuffer->buffer[i - _lineBuffer->minY].resizeErase (
                static_cast<long> (_ofd->bytesPerLine[i - _ofd->minY]));

            for (int j = _ofd->minX; j <= _ofd->maxX; j++)
                _ofd->lineSampleCount[i - _ofd->minY] +=
                    _ofd->getSampleCount (j, i);
        }

        //
        // Copy data from frame buffer to line buffer.
        //

        int y;

        for (y = yStart; y != yStop; y += dy)
        {
            //
            // Gather one scan line's worth of pixel data and store
            // them in _ofd->lineBuffer.
            //

            char* writePtr = &_lineBuffer->buffer[y - _lineBuffer->minY][0];
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                const OutSliceInfo& slice = *_ofd->slices[i];

                if (modp (y, slice.ySampling) != 0) continue;

                //
                // Fill the line buffer with with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _lineBuffer->buffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        _ofd->lineSampleCount[y - _ofd->minY]);
                }
                else
                {

                    copyFromDeepFrameBuffer (
                        writePtr,
                        slice.base,
                        _ofd->sampleCountSliceBase,
                        _ofd->sampleCountXStride,
                        _ofd->sampleCountYStride,
                        y,
                        _ofd->minX,
                        _ofd->maxX,
                        0,
                        0, //offsets for samplecount
                        0,
                        0, //offsets for data
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        _ofd->format,
                        slice.type);
                }
            }
        }

        //
        // If the next scanline isn't past the bounds of the lineBuffer
        // then we have partially filled the linebuffer,
        // otherwise the whole linebuffer is filled and then
        // we compress the linebuffer and write it out.
        //

        if (y >= _lineBuffer->minY && y <= _lineBuffer->maxY) return;

        //
        // Copy all data into a consecutive buffer.
        //

        uint64_t totalBytes      = 0;
        uint64_t maxBytesPerLine = 0;
        for (int i = 0; i < _lineBuffer->maxY - _lineBuffer->minY + 1; i++)
        {
            totalBytes += _lineBuffer->buffer[i].size ();
            if (uint64_t (_lineBuffer->buffer[i].size ()) > maxBytesPerLine)
                maxBytesPerLine = _lineBuffer->buffer[i].size ();
        }
        _lineBuffer->consecutiveBuffer.resizeErase (
            static_cast<long> (totalBytes));

        int pos = 0;
        for (int i = 0; i < _lineBuffer->maxY - _lineBuffer->minY + 1; i++)
        {
            memcpy (
                _lineBuffer->consecutiveBuffer + pos,
                &_lineBuffer->buffer[i][0],
                _lineBuffer->buffer[i].size ());
            pos += _lineBuffer->buffer[i].size ();
        }

        _lineBuffer->dataPtr = _lineBuffer->consecutiveBuffer;

        _lineBuffer->dataSize             = totalBytes;
        _lineBuffer->uncompressedDataSize = _lineBuffer->dataSize;

        //
        // Compress the pixel sample count table.
        //

        char*    ptr           = _lineBuffer->sampleCountTableBuffer;
        uint64_t tableDataSize = 0;
        for (int i = _lineBuffer->minY; i <= _lineBuffer->maxY; i++)
        {
            int count = 0;
            for (int j = _ofd->minX; j <= _ofd->maxX; j++)
            {
                count += _ofd->getSampleCount (j, i);
                Xdr::write<CharPtrIO> (ptr, count);
                tableDataSize += sizeof (int);
            }
        }

        if (_lineBuffer->sampleCountTableCompressor)
        {
            _lineBuffer->sampleCountTableSize =
                _lineBuffer->sampleCountTableCompressor->compress (
                    _lineBuffer->sampleCountTableBuffer,
                    static_cast<int> (tableDataSize),
                    _lineBuffer->minY,
                    _lineBuffer->sampleCountTablePtr);
        }

        //
        // If we can't make data shrink (or we weren't compressing), then just use the raw data.
        //

        if (!_lineBuffer->sampleCountTableCompressor ||
            _lineBuffer->sampleCountTableSize >= tableDataSize)
        {
            _lineBuffer->sampleCountTableSize = tableDataSize;
            _lineBuffer->sampleCountTablePtr =
                _lineBuffer->sampleCountTableBuffer;
        }

        //
        // Compress the sample data
        //

        // (TODO) don't do this all the time.
        if (_lineBuffer->compressor != 0) delete _lineBuffer->compressor;
        _lineBuffer->compressor = newCompressor (
            _ofd->header.compression (), maxBytesPerLine, _ofd->header);

        Compressor* compressor = _lineBuffer->compressor;

        if (compressor)
        {
            const char* compPtr;

            uint64_t compSize = compressor->compress (
                _lineBuffer->dataPtr,
                static_cast<int> (_lineBuffer->dataSize),
                _lineBuffer->minY,
                compPtr);

            if (compSize < _lineBuffer->dataSize)
            {
                _lineBuffer->dataSize = compSize;
                _lineBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using the machine's
                // native format, so we need to convert the lineBuffer
                // to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _lineBuffer->consecutiveBuffer,
                    _lineBuffer->minY,
                    _lineBuffer->maxY,
                    static_cast<int> (_lineBuffer->dataSize));
            }
        }

        _lineBuffer->partiallyFull = false;
    }
    catch (std::exception& e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}